

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall
despot::BaseTag::MostLikelyOpponentPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  double dVar1;
  pointer ppSVar2;
  pointer piVar3;
  State *pSVar4;
  pointer pdVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  allocator_type local_11;
  
  if ((MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
       ::probs == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
    iVar6 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyOpponentPosition::probs,(long)iVar6,&local_11);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                 &MostLikelyOpponentPosition::probs,&__dso_handle);
    __cxa_guard_release();
  }
  pdVar5 = MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    piVar3 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pSVar4 = ppSVar2[lVar8];
      iVar6 = piVar3[*(int *)(pSVar4 + 0xc)];
      pdVar5[iVar6] = *(double *)(pSVar4 + 0x18) + pdVar5[iVar6];
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  pdVar5 = MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    lVar7 = (long)MostLikelyOpponentPosition::probs.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)MostLikelyOpponentPosition::probs.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    dVar9 = 0.0;
    lVar8 = 0;
    do {
      dVar1 = pdVar5[lVar8];
      if (dVar9 < dVar1) {
        dVar9 = dVar1;
      }
      pdVar5[lVar8] = 0.0;
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyOpponentPosition(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[opp_[tagstate->state_id]] += tagstate->weight;
	}

	double maxWeight = 0;
	int opp = -1;
	for (int i = 0; i < probs.size(); i++) {
		if (probs[i] > maxWeight) {
			maxWeight = probs[i];
			opp = i;
		}
		probs[i] = 0.0;
	}

	return floor_.GetCell(opp);
}